

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexParameterErrors
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  GLint GVar1;
  bool bVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLuint local_b0;
  GLenum local_ac;
  GLuint value_3;
  GLint value_2;
  GLfloat value_1;
  GLint value;
  IntPair *param;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_90;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_88;
  const_iterator iter;
  int local_78;
  pair<int,_int> local_74 [2];
  int local_60 [2];
  pair<int,_int> local_58;
  undefined1 local_50 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> params;
  GLint immutableFormat;
  GLint depth;
  GLuint texture;
  GLenum GStack_24;
  bool result;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureAllocationTestCase *this_local;
  
  texture = format;
  GStack_24 = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  std::operator<<((ostream *)&this->field_0x88,"Verify TexParameter errors - ");
  depth._3_1_ = 1;
  gl4cts::Texture::Generate(_format_local,(GLuint *)&immutableFormat);
  gl4cts::Texture::Bind(_format_local,immutableFormat,GStack_24);
  params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = SparseTextureUtils::getTargetDepth(GStack_24);
  gl4cts::Texture::Storage
            (_format_local,GStack_24,1,texture,8,8,
             params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  GVar3 = (*_format_local->getError)();
  bVar2 = SparseTextureUtils::verifyError(&this->mLog,"TexStorage",GVar3,0);
  if (bVar2) {
    (*_format_local->getTexParameteriv)
              (GStack_24,0x912f,
               (GLint *)&params.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    GVar3 = GStack_24;
    GVar4 = (*_format_local->getError)();
    bVar2 = SparseTextureUtils::verifyQueryError
                      (&this->mLog,"getTexParameteriv",GVar3,0x912f,GVar4,0);
    if (bVar2) {
      if ((int)params.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_50);
        local_60[1] = 0x91a6;
        local_60[0] = 1;
        std::pair<int,_int>::pair<int,_int,_true>(&local_58,local_60 + 1,local_60);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_50,
                   &local_58);
        local_78 = 0x91a7;
        iter._M_current._4_4_ = 1;
        std::pair<int,_int>::pair<int,_int,_true>
                  (local_74,&local_78,(int *)((long)&iter._M_current + 4));
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_50,
                   local_74);
        local_90._M_current =
             (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_50);
        __gnu_cxx::
        __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
        ::__normal_iterator<std::pair<int,int>*>
                  ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                    *)&local_88,&local_90);
        while( true ) {
          param = (IntPair *)
                  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             local_50);
          bVar2 = __gnu_cxx::operator!=
                            (&local_88,
                             (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                              *)&param);
          if (!bVar2) break;
          _value_1 = __gnu_cxx::
                     __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                     ::operator*(&local_88);
          if ((depth._3_1_ & 1) != 0) {
            (*_format_local->texParameteri)(GStack_24,_value_1->first,_value_1->second);
            GVar3 = GStack_24;
            GVar1 = _value_1->first;
            GVar4 = (*_format_local->getError)();
            depth._3_1_ = SparseTextureUtils::verifyQueryError
                                    (&this->mLog,"glTexParameteri",GVar3,GVar1,GVar4,0x502);
          }
          if ((depth._3_1_ & 1) != 0) {
            (*_format_local->texParameterf)(GStack_24,_value_1->first,(float)_value_1->second);
            GVar3 = GStack_24;
            GVar1 = _value_1->first;
            GVar4 = (*_format_local->getError)();
            depth._3_1_ = SparseTextureUtils::verifyQueryError
                                    (&this->mLog,"glTexParameterf",GVar3,GVar1,GVar4,0x502);
          }
          if ((depth._3_1_ & 1) != 0) {
            value_2 = _value_1->second;
            (*_format_local->texParameteriv)(GStack_24,_value_1->first,&value_2);
            GVar3 = GStack_24;
            GVar1 = _value_1->first;
            GVar4 = (*_format_local->getError)();
            depth._3_1_ = SparseTextureUtils::verifyQueryError
                                    (&this->mLog,"glTexParameteriv",GVar3,GVar1,GVar4,0x502);
          }
          if ((depth._3_1_ & 1) != 0) {
            value_3 = (GLuint)(float)_value_1->second;
            (*_format_local->texParameterfv)(GStack_24,_value_1->first,(GLfloat *)&value_3);
            GVar3 = GStack_24;
            GVar1 = _value_1->first;
            GVar4 = (*_format_local->getError)();
            depth._3_1_ = SparseTextureUtils::verifyQueryError
                                    (&this->mLog,"glTexParameterfv",GVar3,GVar1,GVar4,0x502);
          }
          if ((depth._3_1_ & 1) != 0) {
            local_ac = _value_1->second;
            (*_format_local->texParameterIiv)(GStack_24,_value_1->first,(GLint *)&local_ac);
            GVar3 = GStack_24;
            GVar1 = _value_1->first;
            GVar4 = (*_format_local->getError)();
            depth._3_1_ = SparseTextureUtils::verifyQueryError
                                    (&this->mLog,"glTexParameterIiv",GVar3,GVar1,GVar4,0x502);
          }
          if ((depth._3_1_ & 1) != 0) {
            local_b0 = _value_1->second;
            (*_format_local->texParameterIuiv)(GStack_24,_value_1->first,&local_b0);
            GVar3 = GStack_24;
            GVar1 = _value_1->first;
            GVar4 = (*_format_local->getError)();
            depth._3_1_ = SparseTextureUtils::verifyQueryError
                                    (&this->mLog,"glTexParameterIuiv",GVar3,GVar1,GVar4,0x502);
          }
          __gnu_cxx::
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_88);
        }
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_50);
      }
      gl4cts::Texture::Delete(_format_local,(GLuint *)&immutableFormat);
      this_local._7_1_ = (bool)(depth._3_1_ & 1);
    }
    else {
      gl4cts::Texture::Delete(_format_local,(GLuint *)&immutableFormat);
      this_local._7_1_ = false;
    }
  }
  else {
    gl4cts::Texture::Delete(_format_local,(GLuint *)&immutableFormat);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexParameterErrors(const Functions& gl, GLint target, GLint format)
{
	mLog << "Verify TexParameter errors - ";

	bool result = true;

	GLuint texture;
	GLint  depth;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	depth = SparseTextureUtils::getTargetDepth(target);

	Texture::Storage(gl, target, 1, format, 8, 8, depth);
	if (!SparseTextureUtils::verifyError(mLog, "TexStorage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	GLint immutableFormat;

	gl.getTexParameteriv(target, GL_TEXTURE_IMMUTABLE_FORMAT, &immutableFormat);
	if (!SparseTextureUtils::verifyQueryError(mLog, "getTexParameteriv", target, GL_TEXTURE_IMMUTABLE_FORMAT,
											  gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	// Test error only if texture is immutable format, otherwise skip
	if (immutableFormat == GL_TRUE)
	{
		std::vector<IntPair> params;
		params.push_back(IntPair(GL_TEXTURE_SPARSE_ARB, GL_TRUE));
		params.push_back(IntPair(GL_VIRTUAL_PAGE_SIZE_INDEX_ARB, 1));

		for (std::vector<IntPair>::const_iterator iter = params.begin(); iter != params.end(); ++iter)
		{
			const IntPair& param = *iter;

			if (result)
			{
				gl.texParameteri(target, param.first, param.second);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteri", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				gl.texParameterf(target, param.first, (GLfloat)param.second);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterf", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLint value = param.second;
				gl.texParameteriv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteriv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLfloat value = (GLfloat)param.second;
				gl.texParameterfv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterfv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLint value = param.second;
				gl.texParameterIiv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIiv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}

			if (result)
			{
				GLuint value = param.second;
				gl.texParameterIuiv(target, param.first, &value);
				result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIuiv", target, param.first,
															  gl.getError(), GL_INVALID_OPERATION);
			}
		}
	}

	Texture::Delete(gl, texture);
	return result;
}